

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FeatureSet::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  FeatureSet **v1;
  FeatureSet **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  anon_union_64_1_493b367e_for_FeatureSet_53 *this;
  FeatureSet *extendee;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  FeatureSet *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FeatureSet *from;
  FeatureSet *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (FeatureSet *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (FeatureSet *)to_msg;
  _this = (FeatureSet *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::FeatureSet_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::FeatureSet*>(&from)
  ;
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x28),0);
    uVar1 = *puVar3;
    if ((uVar1 & 0xff) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.field_presence_ = *(int *)(absl_log_internal_check_op_result + 0x30);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.enum_type_ = *(int *)(absl_log_internal_check_op_result + 0x34);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.repeated_field_encoding_ =
             *(int *)(absl_log_internal_check_op_result + 0x38);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.utf8_validation_ = *(int *)(absl_log_internal_check_op_result + 0x3c)
        ;
      }
      if ((uVar1 & 0x10) != 0) {
        (from->field_0)._impl_.message_encoding_ =
             *(int *)(absl_log_internal_check_op_result + 0x40);
      }
      if ((uVar1 & 0x20) != 0) {
        (from->field_0)._impl_.json_format_ = *(int *)(absl_log_internal_check_op_result + 0x44);
      }
      if ((uVar1 & 0x40) != 0) {
        (from->field_0)._impl_.enforce_naming_style_ =
             *(int *)(absl_log_internal_check_op_result + 0x48);
      }
      if ((uVar1 & 0x80) != 0) {
        (from->field_0)._impl_.default_symbol_visibility_ =
             *(int *)(absl_log_internal_check_op_result + 0x4c);
      }
    }
    puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    this = &from->field_0;
    extendee = default_instance();
    internal::ExtensionSet::MergeFrom
              (&(this->_impl_)._extensions_,(MessageLite *)extendee,
               (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x3565,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void FeatureSet::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FeatureSet*>(&to_msg);
  auto& from = static_cast<const FeatureSet&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FeatureSet)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.field_presence_ = from._impl_.field_presence_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.enum_type_ = from._impl_.enum_type_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.repeated_field_encoding_ = from._impl_.repeated_field_encoding_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.utf8_validation_ = from._impl_.utf8_validation_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.message_encoding_ = from._impl_.message_encoding_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.json_format_ = from._impl_.json_format_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.enforce_naming_style_ = from._impl_.enforce_naming_style_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_symbol_visibility_ = from._impl_.default_symbol_visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}